

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celt_lpc.c
# Opt level: O3

void celt_iir(opus_val32 *_x,opus_val16 *den,opus_val32 *_y,int N,int ord,opus_val16 *mem)

{
  opus_val32 *poVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  opus_val16 *poVar8;
  opus_val16 *poVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  undefined4 in_register_00000084;
  uint uVar13;
  ulong uVar14;
  float *pfVar15;
  ulong uVar16;
  int iVar17;
  opus_val32 oVar18;
  opus_val32 oVar19;
  opus_val32 oVar20;
  opus_val32 oVar21;
  opus_val16 oVar22;
  float fVar23;
  float fVar24;
  opus_val16 oVar25;
  float fVar26;
  float fVar27;
  opus_val16 oVar28;
  opus_val16 aoStack_70 [2];
  float afStack_68 [2];
  ulong local_60;
  undefined8 local_58;
  opus_val32 *local_50;
  opus_val16 *local_48;
  uint local_3c;
  opus_val16 *local_38;
  
  uVar16 = (ulong)(uint)ord;
  pfVar15 = (float *)((long)afStack_68 - (uVar16 * 4 + 0xf & 0xfffffffffffffff0));
  uVar6 = ord + N;
  poVar9 = (opus_val16 *)((long)pfVar15 - ((ulong)uVar6 * 4 + 0xf & 0xfffffffffffffff0));
  local_38 = poVar9;
  pfVar10 = pfVar15;
  uVar11 = uVar16;
  uVar7 = 0;
  if (0 < ord) {
    do {
      *pfVar10 = den[uVar11 - 1];
      uVar11 = uVar11 - 1;
      pfVar10 = pfVar10 + 1;
    } while (uVar11 != 0);
    poVar8 = local_38;
    uVar11 = uVar16;
    uVar7 = 0;
    if (0 < ord) {
      do {
        *poVar8 = -mem[uVar11 - 1];
        uVar11 = uVar11 - 1;
        poVar8 = poVar8 + 1;
        uVar7 = ord;
      } while (uVar11 != 0);
    }
  }
  local_58 = CONCAT44(in_register_00000084,ord);
  local_50 = _x;
  local_48 = mem;
  if ((int)uVar7 < (int)uVar6) {
    poVar8 = local_38 + uVar7;
    poVar9[-2] = 1.477934e-39;
    poVar9[-1] = 0.0;
    memset(poVar8,0,(ulong)(uVar6 + ~uVar7) * 4 + 4);
  }
  uVar7 = (uint)local_58;
  uVar11 = 0;
  if (3 < N) {
    local_60 = (ulong)(N - 3);
    local_3c = uVar7 & 0x7ffffffc;
    uVar11 = 0;
    do {
      poVar1 = local_50 + uVar11;
      oVar18 = *poVar1;
      oVar19 = poVar1[1];
      oVar20 = poVar1[2];
      oVar21 = poVar1[3];
      poVar9 = local_38 + uVar11;
      pfVar12 = poVar9 + 3;
      fVar27 = *poVar9;
      fVar23 = poVar9[3];
      fVar26 = poVar9[4];
      fVar24 = 0.0;
      uVar13 = 0;
      pfVar10 = pfVar15;
      oVar28 = fVar27;
      uVar6 = uVar13;
      oVar22 = fVar23;
      oVar25 = fVar26;
      if (3 < (int)uVar7) {
        do {
          fVar24 = *pfVar12;
          fVar27 = pfVar12[1];
          fVar23 = pfVar12[2];
          fVar26 = pfVar12[3];
          fVar2 = *pfVar10;
          fVar3 = pfVar10[1];
          fVar4 = pfVar10[2];
          fVar5 = pfVar10[3];
          pfVar10 = pfVar10 + 4;
          pfVar12 = pfVar12 + 4;
          oVar18 = (opus_val32)
                   (fVar5 * fVar24 +
                   oVar25 * fVar4 + fVar3 * oVar22 + oVar28 * fVar2 + (float)oVar18);
          oVar19 = (opus_val32)
                   (fVar5 * fVar27 +
                   fVar24 * fVar4 + fVar3 * oVar25 + oVar22 * fVar2 + (float)oVar19);
          oVar20 = (opus_val32)
                   (fVar5 * fVar23 +
                   fVar27 * fVar4 + fVar3 * fVar24 + oVar25 * fVar2 + (float)oVar20);
          oVar21 = (opus_val32)
                   (fVar5 * fVar26 +
                   fVar23 * fVar4 + fVar3 * fVar27 + fVar24 * fVar2 + (float)oVar21);
          uVar13 = uVar13 + 4;
          oVar28 = fVar27;
          uVar6 = uVar7 & 0x7ffffffc;
          oVar22 = fVar23;
          oVar25 = fVar26;
        } while ((int)uVar13 < (int)(uVar7 - 3));
      }
      if ((int)uVar6 < (int)uVar7) {
        fVar24 = *pfVar12;
        pfVar12 = pfVar12 + 1;
        fVar2 = *pfVar10;
        pfVar10 = pfVar10 + 1;
        oVar18 = (opus_val32)((float)oVar18 + fVar27 * fVar2);
        oVar19 = (opus_val32)((float)oVar19 + fVar23 * fVar2);
        oVar20 = (opus_val32)((float)oVar20 + fVar26 * fVar2);
        oVar21 = (opus_val32)((float)oVar21 + fVar24 * fVar2);
      }
      if ((int)(uVar6 | 1) < (int)uVar7) {
        fVar27 = *pfVar12;
        pfVar12 = pfVar12 + 1;
        fVar2 = *pfVar10;
        pfVar10 = pfVar10 + 1;
        oVar18 = (opus_val32)((float)oVar18 + fVar23 * fVar2);
        oVar19 = (opus_val32)((float)oVar19 + fVar26 * fVar2);
        oVar20 = (opus_val32)((float)oVar20 + fVar24 * fVar2);
        oVar21 = (opus_val32)((float)oVar21 + fVar27 * fVar2);
      }
      if ((int)(uVar6 | 2) < (int)uVar7) {
        fVar23 = *pfVar10;
        oVar18 = (opus_val32)((float)oVar18 + fVar26 * fVar23);
        oVar19 = (opus_val32)((float)oVar19 + fVar24 * fVar23);
        oVar20 = (opus_val32)((float)oVar20 + fVar27 * fVar23);
        oVar21 = (opus_val32)((float)oVar21 + *pfVar12 * fVar23);
      }
      local_38[(long)(int)uVar7 + uVar11] = -(float)oVar18;
      _y[uVar11] = oVar18;
      fVar24 = (float)oVar19 - *den * (float)oVar18;
      local_38[(long)(int)uVar7 + uVar11 + 1] = -fVar24;
      _y[uVar11 | 1] = (opus_val32)fVar24;
      fVar27 = ((float)oVar20 - *den * fVar24) - den[1] * (float)oVar18;
      local_38[(long)(int)uVar7 + uVar11 + 2] = -fVar27;
      _y[uVar11 | 2] = (opus_val32)fVar27;
      fVar24 = (((float)oVar21 - fVar27 * *den) - fVar24 * den[1]) - den[2] * (float)oVar18;
      local_38[(long)(int)uVar7 + uVar11 + 3] = -fVar24;
      _y[uVar11 | 3] = (opus_val32)fVar24;
      uVar11 = uVar11 + 4;
    } while (uVar11 < N - 3);
  }
  if ((int)uVar11 < N) {
    uVar11 = uVar11 & 0xffffffff;
    poVar9 = local_38 + uVar11;
    do {
      oVar18 = local_50[uVar11];
      if (0 < (int)uVar7) {
        uVar14 = 0;
        do {
          oVar18 = (opus_val32)((float)oVar18 - pfVar15[uVar14] * poVar9[uVar14]);
          uVar14 = uVar14 + 1;
        } while (uVar16 != uVar14);
      }
      local_38[(long)(int)uVar7 + uVar11] = (opus_val16)oVar18;
      _y[uVar11] = oVar18;
      uVar11 = uVar11 + 1;
      poVar9 = poVar9 + 1;
    } while (uVar11 != (uint)N);
  }
  if (0 < (int)uVar7) {
    iVar17 = N + -1;
    uVar11 = 0;
    do {
      local_48[uVar11] = (opus_val16)_y[iVar17];
      uVar11 = uVar11 + 1;
      iVar17 = iVar17 + -1;
    } while (uVar16 != uVar11);
  }
  return;
}

Assistant:

void celt_iir(const opus_val32 *_x,
              const opus_val16 *den,
              opus_val32 *_y,
              int N,
              int ord,
              opus_val16 *mem) {
#ifdef SMALL_FOOTPRINT
    int i,j;
    for (i=0;i<N;i++)
    {
       opus_val32 sum = _x[i];
       for (j=0;j<ord;j++)
       {
          sum -= MULT16_16(den[j],mem[j]);
       }
       for (j=ord-1;j>=1;j--)
       {
          mem[j]=mem[j-1];
       }
       mem[0] = SROUND16(sum, SIG_SHIFT);
       _y[i] = sum;
    }
#else
    int i, j;
    celt_assert((ord & 3) == 0);
    opus_val16 rden[ord];
    opus_val16 y[N + ord];
    for (i = 0; i < ord; i++)
        rden[i] = den[ord - i - 1];
    for (i = 0; i < ord; i++)
        y[i] = -mem[ord - i - 1];
    for (; i < N + ord; i++)
        y[i] = 0;
    for (i = 0; i < N - 3; i += 4) {
        /* Unroll by 4 as if it were an FIR filter */
        opus_val32 sum[4];
        sum[0] = _x[i];
        sum[1] = _x[i + 1];
        sum[2] = _x[i + 2];
        sum[3] = _x[i + 3];
        xcorr_kernel(rden, y + i, sum, ord);

        /* Patch up the result to compensate for the fact that this is an IIR */
        y[i + ord] = -SROUND16(sum[0], SIG_SHIFT);
        _y[i] = sum[0];
        sum[1] = MAC16_16(sum[1], y[i + ord], den[0]);
        y[i + ord + 1] = -SROUND16(sum[1], SIG_SHIFT);
        _y[i + 1] = sum[1];
        sum[2] = MAC16_16(sum[2], y[i + ord + 1], den[0]);
        sum[2] = MAC16_16(sum[2], y[i + ord], den[1]);
        y[i + ord + 2] = -SROUND16(sum[2], SIG_SHIFT);
        _y[i + 2] = sum[2];

        sum[3] = MAC16_16(sum[3], y[i + ord + 2], den[0]);
        sum[3] = MAC16_16(sum[3], y[i + ord + 1], den[1]);
        sum[3] = MAC16_16(sum[3], y[i + ord], den[2]);
        y[i + ord + 3] = -SROUND16(sum[3], SIG_SHIFT);
        _y[i + 3] = sum[3];
    }
    for (; i < N; i++) {
        opus_val32 sum = _x[i];
        for (j = 0; j < ord; j++)
            sum -= MULT16_16(rden[j], y[i + j]);
        y[i + ord] = SROUND16(sum, SIG_SHIFT);
        _y[i] = sum;
    }
    for (i = 0; i < ord; i++)
        mem[i] = _y[N - i - 1];
#endif
}